

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void test_fs_partial(int doread)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  void *__s1;
  undefined8 uVar4;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  int pipe_fds [2];
  thread_ctx_conflict ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int local_100 [2];
  pthread_t local_f8;
  int local_f0;
  void *local_e8;
  undefined8 local_e0;
  int local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [152];
  
  __ptr = malloc(0xd4310);
  if (__ptr == (void *)0x0) {
LAB_0016266a:
    test_fs_partial_cold_17();
LAB_0016266f:
    test_fs_partial_cold_16();
LAB_00162674:
    test_fs_partial_cold_15();
LAB_00162679:
    test_fs_partial_cold_1();
LAB_0016267e:
    test_fs_partial_cold_2();
LAB_00162683:
    test_fs_partial_cold_3();
LAB_00162688:
    test_fs_partial_cold_4();
LAB_0016268d:
    test_fs_partial_cold_8();
LAB_00162692:
    test_fs_partial_cold_9();
LAB_00162697:
    test_fs_partial_cold_10();
LAB_0016269c:
    test_fs_partial_cold_11();
LAB_001626a1:
    test_fs_partial_cold_12();
LAB_001626a6:
    test_fs_partial_cold_13();
LAB_001626ab:
    test_fs_partial_cold_14();
  }
  else {
    local_f8 = pthread_self();
    local_e0 = 0x3e8000ac67d;
    local_d8 = doread;
    local_e8 = malloc(0xac67d);
    if (local_e8 == (void *)0x0) goto LAB_0016266f;
    __s1 = malloc(0xac67d);
    if (__s1 == (void *)0x0) goto LAB_00162674;
    lVar7 = 8;
    pvVar8 = __s1;
    do {
      auVar10 = uv_buf_init(pvVar8,0xd);
      *(long *)((long)__ptr + lVar7 + -8) = auVar10._0_8_;
      *(long *)((long)__ptr + lVar7) = auVar10._8_8_;
      lVar7 = lVar7 + 0x10;
      pvVar8 = (void *)((long)pvVar8 + 0xd);
    } while (lVar7 != 0xd4318);
    loop = (uv_loop_t *)uv_default_loop();
    iVar2 = uv_signal_init(loop,local_c8);
    if (iVar2 != 0) goto LAB_00162679;
    iVar2 = uv_signal_start(local_c8,sig_func,10);
    if (iVar2 != 0) goto LAB_0016267e;
    iVar2 = pipe(local_100);
    if (iVar2 != 0) goto LAB_00162683;
    local_f0 = local_100[(uint)doread];
    iVar2 = uv_thread_create(local_d0,thread_main);
    if (iVar2 != 0) goto LAB_00162688;
    if (doread != 0) {
      if (0 < (int)local_e0) {
        iVar2 = 0;
        uVar9 = 0xd431;
        pvVar8 = __ptr;
        do {
          uVar3 = uv_fs_read(loop,&read_req,local_100[0],pvVar8,uVar9 & 0xffffffff,
                             0xffffffffffffffff,0);
          if ((int)uVar3 < 1) {
            if (uVar3 != 0xfffffffc) {
              test_fs_partial_cold_5();
              goto LAB_0016266a;
            }
          }
          else {
            uVar5 = (ulong)uVar3;
            puVar6 = (ulong *)((long)pvVar8 + 8);
            lVar7 = 0;
            do {
              uVar1 = *puVar6;
              if (uVar5 <= uVar1 && uVar1 - uVar5 != 0) {
                puVar6[-1] = puVar6[-1] + uVar5;
                *puVar6 = uVar1 - uVar5;
                break;
              }
              lVar7 = lVar7 + 1;
              puVar6 = puVar6 + 2;
              uVar5 = uVar5 - uVar1;
            } while (uVar5 != 0);
            uVar9 = uVar9 - lVar7;
            pvVar8 = (void *)((long)pvVar8 + lVar7 * 0x10);
            iVar2 = iVar2 + uVar3;
          }
          uv_fs_req_cleanup(&read_req);
        } while (iVar2 < (int)local_e0);
      }
LAB_0016254f:
      iVar2 = bcmp(__s1,local_e8,(long)(int)local_e0);
      if (iVar2 != 0) goto LAB_0016268d;
      iVar2 = uv_thread_join();
      if (iVar2 != 0) goto LAB_00162692;
      iVar2 = uv_run(loop,0);
      if (iVar2 != 0) goto LAB_00162697;
      iVar2 = close(local_100[1]);
      if (iVar2 != 0) goto LAB_0016269c;
      uv_close(local_c8,0);
      iVar2 = uv_fs_read(loop,&read_req,local_100[0],__ptr,1,0xffffffffffffffff,0);
      if (iVar2 != 0) goto LAB_001626a1;
      uv_fs_req_cleanup(&read_req);
      iVar2 = close(local_100[0]);
      if (iVar2 != 0) goto LAB_001626a6;
      free(__ptr);
      free(__s1);
      free(local_e8);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uv_default_loop();
      iVar2 = uv_loop_close();
      if (iVar2 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001626ab;
    }
    iVar2 = uv_fs_write(loop,&write_req,local_100[1],__ptr,0xd431,0xffffffffffffffff,0);
    if (write_req.result == iVar2) {
      if (iVar2 != (int)local_e0) goto LAB_001626b5;
      uv_fs_req_cleanup(&write_req);
      goto LAB_0016254f;
    }
  }
  test_fs_partial_cold_6();
LAB_001626b5:
  test_fs_partial_cold_7();
  test_fs_partial(0);
  return;
}

Assistant:

static void test_fs_partial(int doread) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int pipe_fds[2];
  size_t iovcount;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;

  iovcount = 54321;

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT_NOT_NULL(iovs);

  ctx.pid = pthread_self();
  ctx.doread = doread;
  ctx.interval = 1000;
  ctx.size = sizeof(test_buf) * iovcount;
  ctx.data = malloc(ctx.size);
  ASSERT_NOT_NULL(ctx.data);
  buffer = malloc(ctx.size);
  ASSERT_NOT_NULL(buffer);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf), sizeof(test_buf));

  loop = uv_default_loop();

  ASSERT(0 == uv_signal_init(loop, &signal));
  ASSERT(0 == uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT(0 == pipe(pipe_fds));

  ctx.fd = pipe_fds[doread];
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));

  if (doread) {
    uv_buf_t* read_iovs;
    int nread;
    read_iovs = iovs;
    nread = 0;
    while (nread < ctx.size) {
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], read_iovs, iovcount, -1, NULL);
      if (result > 0) {
        size_t read_iovcount;
        read_iovcount = uv_test_fs_buf_offset(read_iovs, result);
        read_iovs += read_iovcount;
        iovcount -= read_iovcount;
        nread += result;
      } else {
        ASSERT(result == UV_EINTR);
      }
      uv_fs_req_cleanup(&read_req);
    }
  } else {
    int result;
    result = uv_fs_write(loop, &write_req, pipe_fds[1], iovs, iovcount, -1, NULL);
    ASSERT(write_req.result == result);
    ASSERT(result == ctx.size);
    uv_fs_req_cleanup(&write_req);
  }

  ASSERT(0 == memcmp(buffer, ctx.data, ctx.size));

  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(0 == close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  { /* Make sure we read everything that we wrote. */
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], iovs, 1, -1, NULL);
      ASSERT(result == 0);
      uv_fs_req_cleanup(&read_req);
  }
  ASSERT(0 == close(pipe_fds[0]));

  free(iovs);
  free(buffer);
  free(ctx.data);

  MAKE_VALGRIND_HAPPY();
}